

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_no_broadcast<ncnn::BinaryOp_x86_functor::binary_op_min>
               (float *ptr,float *ptr1,float *outptr,int size)

{
  float *pfVar1;
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [16];
  undefined1 (*in_RDI) [16];
  undefined1 auVar2 [16];
  __m128 _outp;
  __m128 _b;
  __m128 _p;
  int i;
  binary_op_min op;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  int local_ac;
  undefined1 local_a5;
  int local_a4;
  float *local_a0;
  undefined1 (*local_98) [16];
  undefined1 (*local_90) [16];
  undefined1 (*local_88) [16];
  undefined1 (*local_80) [16];
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 *local_58;
  undefined8 *local_50;
  undefined1 *local_48;
  undefined1 (*local_40) [16];
  undefined1 (*local_38) [16];
  undefined1 *local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_a0 = in_RDX;
  local_98 = in_RSI;
  local_90 = in_RDI;
  for (local_ac = 0; local_a4 = in_ECX, local_ac + 3 < in_ECX; local_ac = local_ac + 4) {
    local_80 = local_90;
    local_c8 = *(undefined8 *)*local_90;
    uStack_c0 = *(undefined8 *)(*local_90 + 8);
    local_88 = local_98;
    local_d8 = *(undefined8 *)*local_98;
    uStack_d0 = *(undefined8 *)(*local_98 + 8);
    local_48 = &local_a5;
    local_50 = &local_c8;
    local_58 = &local_d8;
    auVar2 = minps(*local_90,*local_98);
    local_60 = local_a0;
    local_e8 = auVar2._0_8_;
    local_78 = local_e8;
    uStack_e0 = auVar2._8_8_;
    uStack_70 = uStack_e0;
    *(undefined8 *)local_a0 = local_e8;
    *(undefined8 *)(local_a0 + 2) = uStack_e0;
    local_90 = local_90 + 1;
    local_98 = local_98 + 1;
    local_a0 = local_a0 + 4;
    local_28 = local_d8;
    uStack_20 = uStack_d0;
    local_18 = local_c8;
    uStack_10 = uStack_c0;
  }
  for (; local_ac < local_a4; local_ac = local_ac + 1) {
    local_30 = &local_a5;
    local_38 = local_90;
    local_40 = local_98;
    pfVar1 = std::min<float>((float *)local_90,(float *)local_98);
    *local_a0 = *pfVar1;
    local_90 = (undefined1 (*) [16])(*local_90 + 4);
    local_98 = (undefined1 (*) [16])(*local_98 + 4);
    local_a0 = local_a0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_no_broadcast(const float* ptr, const float* ptr1, float* outptr, int size)
{
    const Op op;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_p, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_p, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, *ptr1);
        ptr += 1;
        ptr1 += 1;
        outptr += 1;
    }
}